

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O2

uint64_t llvm_vecsmall::detail::NextPowerOf2(uint64_t A)

{
  ulong uVar1;
  
  uVar1 = A >> 1 | A;
  uVar1 = uVar1 >> 2 | uVar1;
  uVar1 = uVar1 >> 4 | uVar1;
  uVar1 = uVar1 >> 8 | uVar1;
  uVar1 = uVar1 >> 0x10 | uVar1;
  return (uVar1 >> 0x20 | uVar1) + 1;
}

Assistant:

inline uint64_t NextPowerOf2(uint64_t A) {
            A |= (A >> 1);
            A |= (A >> 2);
            A |= (A >> 4);
            A |= (A >> 8);
            A |= (A >> 16);
            A |= (A >> 32);
            return A + 1;
        }